

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::(anonymous_namespace)::ConditionalToCheckBitmasks_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *masks,bool return_success,
          StringPiece has_bits_var)

{
  StringPiece str;
  bool bVar1;
  AlphaNum *pAVar2;
  AlphaNum *b;
  const_reference pvVar3;
  LogMessage *other;
  size_type sVar4;
  reference pvVar5;
  undefined7 in_register_00000009;
  AlphaNum *pAVar6;
  AlphaNum *c;
  Hex hex;
  AlphaNum *in_stack_fffffffffffffbe8;
  char *__rhs;
  AlphaNum local_3f0;
  byte local_3b9;
  string local_3b8;
  AlphaNum local_398;
  AlphaNum local_368;
  undefined1 local_338 [8];
  string result;
  LogMessage local_310;
  AlphaNum local_2d8;
  AlphaNum local_2a8;
  AlphaNum local_278;
  AlphaNum local_248;
  AlphaNum local_218;
  AlphaNum local_1e8;
  AlphaNum local_1b8;
  char *local_188;
  AlphaNum *pAStack_180;
  AlphaNum local_170;
  AlphaNum local_140;
  string local_110;
  undefined1 local_f0 [12];
  AlphaNum local_e0;
  AlphaNum local_a0;
  undefined1 local_70 [8];
  string m;
  undefined1 local_48 [4];
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  bool return_success_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *masks_local;
  StringPiece has_bits_var_local;
  
  pAVar6 = (AlphaNum *)has_bits_var.ptr_;
  parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = (byte)masks & 1;
  c = pAVar6;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_48);
  for (m.field_2._12_4_ = 0; pAVar2 = (AlphaNum *)(long)(int)m.field_2._12_4_,
      b = (AlphaNum *)
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this), pAVar2 < b;
      m.field_2._12_4_ = m.field_2._12_4_ + 1) {
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,
                        (long)(int)m.field_2._12_4_);
    if (*pvVar3 != 0) {
      strings::AlphaNum::AlphaNum(&local_a0,"0x");
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,
                          (long)(int)m.field_2._12_4_);
      strings::Hex::Hex<unsigned_int>((Hex *)local_f0,*pvVar3,ZERO_PAD_8);
      hex._12_4_ = 0;
      hex.value = local_f0._0_8_;
      hex.spec = local_f0._8_4_;
      strings::AlphaNum::AlphaNum(&local_e0,hex);
      StrCat_abi_cxx11_((string *)local_70,(protobuf *)&local_a0,&local_e0,b);
      strings::AlphaNum::AlphaNum(&local_140,"((");
      str.length_ = (size_type)pAVar6;
      str.ptr_ = (char *)CONCAT71(in_register_00000009,return_success);
      local_188 = (char *)CONCAT71(in_register_00000009,return_success);
      pAStack_180 = pAVar6;
      strings::AlphaNum::AlphaNum(&local_170,str);
      strings::AlphaNum::AlphaNum(&local_1b8,"[");
      strings::AlphaNum::AlphaNum(&local_1e8,m.field_2._12_4_);
      strings::AlphaNum::AlphaNum(&local_218,"] & ");
      strings::AlphaNum::AlphaNum(&local_248,(string *)local_70);
      strings::AlphaNum::AlphaNum(&local_278,") ^ ");
      strings::AlphaNum::AlphaNum(&local_2a8,(string *)local_70);
      strings::AlphaNum::AlphaNum(&local_2d8,")");
      c = &local_1e8;
      StrCat_abi_cxx11_(&local_110,(protobuf *)&local_140,&local_170,&local_1b8,c,&local_218,
                        &local_248,&local_278,&local_2a8,&local_2d8,in_stack_fffffffffffffbe8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_48,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)local_70);
    }
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_48);
  result.field_2._M_local_buf[0xf] = '\0';
  if (bVar1) {
    b = (AlphaNum *)0x60;
    internal::LogMessage::LogMessage
              (&local_310,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
               ,0x60);
    result.field_2._M_local_buf[0xf] = '\x01';
    other = internal::LogMessage::operator<<(&local_310,"CHECK failed: !parts.empty(): ");
    internal::LogFinisher::operator=((LogFinisher *)(result.field_2._M_local_buf + 0xe),other);
  }
  if ((result.field_2._M_local_buf[0xf] & 1U) != 0) {
    internal::LogMessage::~LogMessage(&local_310);
  }
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_48);
  local_3b9 = 0;
  if (sVar4 == 1) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_48,0);
    std::__cxx11::string::string((string *)local_338,(string *)pvVar5);
  }
  else {
    strings::AlphaNum::AlphaNum(&local_368,"(");
    Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_3b8,(protobuf *)local_48,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)"\n       | ",(char *)b);
    local_3b9 = 1;
    strings::AlphaNum::AlphaNum(&local_398,&local_3b8);
    strings::AlphaNum::AlphaNum(&local_3f0,")");
    StrCat_abi_cxx11_((string *)local_338,(protobuf *)&local_368,&local_398,&local_3f0,c);
  }
  if ((local_3b9 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_3b8);
  }
  if ((parts.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    __rhs = " != 0";
  }
  else {
    __rhs = " == 0";
  }
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338,
                 __rhs);
  std::__cxx11::string::~string((string *)local_338);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string ConditionalToCheckBitmasks(
    const std::vector<uint32_t>& masks, bool return_success = true,
    StringPiece has_bits_var = "_has_bits_") {
  std::vector<std::string> parts;
  for (int i = 0; i < masks.size(); i++) {
    if (masks[i] == 0) continue;
    std::string m = StrCat("0x", strings::Hex(masks[i], strings::ZERO_PAD_8));
    // Each xor evaluates to 0 if the expected bits are present.
    parts.push_back(
        StrCat("((", has_bits_var, "[", i, "] & ", m, ") ^ ", m, ")"));
  }
  GOOGLE_CHECK(!parts.empty());
  // If we have multiple parts, each expected to be 0, then bitwise-or them.
  std::string result =
      parts.size() == 1
          ? parts[0]
          : StrCat("(", Join(parts, "\n       | "), ")");
  return result + (return_success ? " == 0" : " != 0");
}